

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFunctionLibrary.cpp
# Opt level: O1

deFunctionPtr __thiscall
tcu::CompositeFunctionLibrary::getFunction(CompositeFunctionLibrary *this,char *name)

{
  deFunctionPtr p_Var1;
  long lVar2;
  long lVar3;
  
  if (0 < this->m_numLibraries) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      p_Var1 = (deFunctionPtr)
               (**(code **)(*(long *)((long)&this->m_libraries->_vptr_FunctionLibrary + lVar2) +
                           0x10))((long)&this->m_libraries->_vptr_FunctionLibrary + lVar2,name);
      if (p_Var1 != (deFunctionPtr)0x0) {
        return p_Var1;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 8;
    } while (lVar3 < this->m_numLibraries);
  }
  return (deFunctionPtr)0x0;
}

Assistant:

deFunctionPtr CompositeFunctionLibrary::getFunction (const char* name) const
{
	for (int ndx = 0; ndx < m_numLibraries; ndx++)
	{
		const deFunctionPtr ptr = m_libraries[ndx].getFunction(name);
		if (ptr)
			return ptr;
	}
	return DE_NULL;
}